

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O0

int memCompare(word *x,word *y,int nVars)

{
  int local_28;
  int i;
  int nVars_local;
  word *y_local;
  word *x_local;
  
  local_28 = Kit_TruthWordNum_64bit(nVars);
  do {
    local_28 = local_28 + -1;
    if (local_28 < 0) {
      return 0;
    }
  } while (x[local_28] == y[local_28]);
  if (y[local_28] < x[local_28]) {
    x_local._4_4_ = 1;
  }
  else {
    x_local._4_4_ = -1;
  }
  return x_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START


int memCompare(word* x, word*  y, int nVars)
{
    int i;
    for(i=Kit_TruthWordNum_64bit( nVars )-1;i>=0;i--)
    {
        if(x[i]==y[i])
            continue;
        else if(x[i]>y[i])
            return 1;
        else
            return -1;
    }
    return 0;
}